

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,FuncDestructor *pDestructor)

{
  int iVar1;
  uint uVar2;
  FuncDef *pFVar3;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_58;
  int local_4c;
  int rc;
  int extraFlags;
  int nName;
  FuncDef *p;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc_local;
  void *pUserData_local;
  int enc_local;
  int nArg_local;
  char *zFunctionName_local;
  sqlite3 *db_local;
  
  if ((((zFunctionName == (char *)0x0) ||
       ((xSFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
        ((xFinal != (_func_void_sqlite3_context_ptr *)0x0 ||
         (xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))))) ||
      ((xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
       ((xFinal != (_func_void_sqlite3_context_ptr *)0x0 &&
        (xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))))) ||
     ((((xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
        ((xFinal == (_func_void_sqlite3_context_ptr *)0x0 &&
         (xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))) ||
       (nArg < -1)) || ((0x7f < nArg || (iVar1 = sqlite3Strlen30(zFunctionName), 0xff < iVar1))))))
  {
    db_local._4_4_ = sqlite3MisuseError(0x22f7c);
  }
  else {
    uVar2 = enc & 0x800;
    pUserData_local._0_4_ = enc & 7;
    if ((uint)pUserData_local == 4) {
      pUserData_local._0_4_ = 2;
    }
    else if ((uint)pUserData_local == 5) {
      local_4c = sqlite3CreateFunc(db,zFunctionName,nArg,uVar2 | 1,pUserData,xSFunc,xStep,xFinal,
                                   pDestructor);
      if (local_4c == 0) {
        local_4c = sqlite3CreateFunc(db,zFunctionName,nArg,uVar2 | 2,pUserData,xSFunc,xStep,xFinal,
                                     pDestructor);
      }
      if (local_4c != 0) {
        return local_4c;
      }
      pUserData_local._0_4_ = 3;
    }
    pFVar3 = sqlite3FindFunction(db,zFunctionName,nArg,(u8)(uint)pUserData_local,'\0');
    if (((pFVar3 != (FuncDef *)0x0) && ((pFVar3->funcFlags & 3) == (uint)pUserData_local)) &&
       (pFVar3->nArg == nArg)) {
      if (db->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(db,5,"unable to delete/modify user-function due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(db);
    }
    pFVar3 = sqlite3FindFunction(db,zFunctionName,nArg,(u8)(uint)pUserData_local,'\x01');
    if (pFVar3 == (FuncDef *)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      functionDestroy(db,pFVar3);
      if (pDestructor != (FuncDestructor *)0x0) {
        pDestructor->nRef = pDestructor->nRef + 1;
      }
      (pFVar3->u).pDestructor = pDestructor;
      pFVar3->funcFlags = pFVar3->funcFlags & 3 | (ushort)uVar2;
      local_58 = xSFunc;
      if (xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
        local_58 = xStep;
      }
      pFVar3->xSFunc = local_58;
      pFVar3->xFinalize = xFinal;
      pFVar3->pUserData = pUserData;
      pFVar3->nArg = (i8)nArg;
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int nName;
  int extraFlags;

  assert( sqlite3_mutex_held(db->mutex) );
  if( zFunctionName==0 ||
      (xSFunc && (xFinal || xStep)) || 
      (!xSFunc && (xFinal && !xStep)) ||
      (!xSFunc && (!xFinal && xStep)) ||
      (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG) ||
      (255<(nName = sqlite3Strlen30( zFunctionName))) ){
    return SQLITE_MISUSE_BKPT;
  }

  assert( SQLITE_FUNC_CONSTANT==SQLITE_DETERMINISTIC );
  extraFlags = enc &  SQLITE_DETERMINISTIC;
  enc &= (SQLITE_FUNC_ENCMASK|SQLITE_ANY);
  
#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  if( enc==SQLITE_UTF16 ){
    enc = SQLITE_UTF16NATIVE;
  }else if( enc==SQLITE_ANY ){
    int rc;
    rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF8|extraFlags,
         pUserData, xSFunc, xStep, xFinal, pDestructor);
    if( rc==SQLITE_OK ){
      rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF16LE|extraFlags,
          pUserData, xSFunc, xStep, xFinal, pDestructor);
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    enc = SQLITE_UTF16BE;
  }
#else
  enc = SQLITE_UTF8;
#endif
  
  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 0);
  if( p && (p->funcFlags & SQLITE_FUNC_ENCMASK)==enc && p->nArg==nArg ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY, 
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db);
    }
  }

  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->u.pDestructor = pDestructor;
  p->funcFlags = (p->funcFlags & SQLITE_FUNC_ENCMASK) | extraFlags;
  testcase( p->funcFlags & SQLITE_DETERMINISTIC );
  p->xSFunc = xSFunc ? xSFunc : xStep;
  p->xFinalize = xFinal;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}